

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rebalancing.hpp
# Opt level: O3

void __thiscall
Kernel::Rebalancing::BalanceIter<Kernel::Rebalancing::Inverters::NumberTheoryInverter>::BalanceIter
          (BalanceIter<Kernel::Rebalancing::Inverters::NumberTheoryInverter> *this,
          Balancer<Kernel::Rebalancing::Inverters::NumberTheoryInverter> *balancer,bool end)

{
  undefined3 in_register_00000011;
  
  (this->_path)._cursor = (Node *)0x0;
  (this->_path)._end = (Node *)0x0;
  (this->_path)._capacity = 0;
  (this->_path)._stack = (Node *)0x0;
  this->_litIndex = CONCAT31(in_register_00000011,end) * 2;
  this->_balancer = balancer;
  if (CONCAT31(in_register_00000011,end) == 0) {
    findNextVar(this);
  }
  return;
}

Assistant:

BalanceIter<C>::BalanceIter(const Balancer<C>& balancer, bool end) 
  : _path(Stack<Node>())
  , _litIndex(end ? 2 : 0)
  , _balancer(balancer)
{
  if (end) {
    DEBUG("end")
  } else {
    DEBUG("begin(", balancer._lit.toString(), ")");
    ASS(balancer._lit.isEquality())
    findNextVar();
  }
}